

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashids.hpp
# Opt level: O2

string * __thiscall
hashidsxx::Hashids::encode<int_const*>
          (string *__return_storage_ptr__,Hashids *this,int *begin,int *end)

{
  string *input;
  char cVar1;
  string *psVar2;
  int iVar3;
  long lVar4;
  int *piVar5;
  long lVar6;
  undefined1 local_c8 [8];
  string last;
  string alphabet;
  undefined1 local_60 [8];
  string alphabet_salt;
  
  if (begin == end) {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"",(allocator *)(last.field_2._M_local_buf + 8));
  }
  else {
    std::__cxx11::string::string
              ((string *)(last.field_2._M_local_buf + 8),(string *)&this->_alphabet);
    alphabet_salt.field_2._12_4_ = 0;
    iVar3 = 100;
    for (piVar5 = begin; piVar5 != end; piVar5 = piVar5 + 1) {
      alphabet_salt.field_2._12_4_ = alphabet_salt.field_2._12_4_ + *piVar5 % iVar3;
      iVar3 = iVar3 + 1;
    }
    cVar1 = (this->_alphabet)._M_dataplus._M_p
            [(ulong)(long)(int)alphabet_salt.field_2._12_4_ % (this->_alphabet)._M_string_length];
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    if (this->_min_length != 0) {
      std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
    }
    alphabet_salt.field_2._8_4_ = SEXT14(cVar1);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    input = (string *)(last.field_2._M_local_buf + 8);
    lVar6 = 0;
    for (lVar4 = 0; (int *)((long)begin + lVar4) != end; lVar4 = lVar4 + 4) {
      iVar3 = begin[lVar6];
      local_60 = (undefined1  [8])&alphabet_salt._M_string_length;
      alphabet_salt._M_dataplus._M_p = (pointer)0x0;
      alphabet_salt._M_string_length._0_1_ = 0;
      std::__cxx11::string::push_back((char)local_60);
      psVar2 = (string *)std::__cxx11::string::append((string *)local_60);
      std::__cxx11::string::append(psVar2);
      _reorder(this,input,(string *)local_60);
      std::__cxx11::string::_M_assign((string *)input);
      _hash((string *)local_c8,this,(long)iVar3,input);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)local_c8);
      std::__cxx11::string::~string((string *)local_60);
      lVar6 = lVar6 + 1;
    }
    std::__cxx11::string::erase
              (__return_storage_ptr__,
               (__return_storage_ptr__->_M_dataplus)._M_p +
               (__return_storage_ptr__->_M_string_length - 1));
    if (__return_storage_ptr__->_M_string_length < (ulong)this->_min_length) {
      _ensure_length(this,__return_storage_ptr__,(string *)((long)&last.field_2 + 8),
                     alphabet_salt.field_2._12_4_);
    }
    std::__cxx11::string::~string((string *)(last.field_2._M_local_buf + 8));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string encode(const Iterator begin, const Iterator end) const {
    // Encrypting nothing makes no sense
    if (begin == end)
      return "";

    // Make a copy of our alphabet so we can reorder it on the fly etc
    std::string alphabet(_alphabet);

    int values_hash = 0;
    int i = 0;
    for (Iterator iter = begin; iter != end; ++iter) {
      values_hash += (*iter % (i + 100));
      ++i;
    };

    char encoded = _alphabet[values_hash % _alphabet.size()];
    char lottery = encoded;

    std::string output;
    if (_min_length > 0)
      output.reserve(_min_length); // reserve if we have a minimum length
    output.push_back(encoded);

    i = 0;
    for (Iterator iter = begin; iter != end; ++iter) {
      uint64_t number = *iter;

      std::string alphabet_salt;
      alphabet_salt.push_back(lottery);
      alphabet_salt.append(_salt).append(alphabet);

      alphabet = _reorder(alphabet, alphabet_salt);

      std::string last = _hash(number, alphabet);
      output.append(last);

      number %= last[0] + i;
      output.push_back(_separators[number % _separators.size()]);
      ++i;
    };

    // pop_back() is only available with C++11
    output.erase(output.end() - 1);

    if (output.size() < _min_length)
      _ensure_length(output, alphabet, values_hash);

    return output;
  }